

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  OneofDescriptor *oneof_descriptor;
  uint32_t *puVar6;
  Message **ppMVar7;
  Message *ret;
  Message **result;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,actual,field,"ReleaseMessage");
  }
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
  }
  result = (Message **)factory;
  if (factory == (MessageFactory *)0x0) {
    result = (Message **)this->message_factory_;
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    this_local = (Reflection *)
                 internal::ExtensionSet::UnsafeArenaReleaseMessage
                           (this_00,field,(MessageFactory *)result);
  }
  else {
    bVar1 = FieldDescriptor::is_repeated(field);
    if ((!bVar1) && (bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field), !bVar1))
    {
      ClearHasBit(this,message,field);
    }
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if (bVar1) {
      bVar1 = HasOneofField(this,message,field);
      if (!bVar1) {
        return (Message *)0x0;
      }
      oneof_descriptor = FieldDescriptor::containing_oneof(field);
      puVar6 = MutableOneofCase(this,message,oneof_descriptor);
      *puVar6 = 0;
    }
    ppMVar7 = MutableRaw<google::protobuf::Message*>(this,message,field);
    this_local = (Reflection *)*ppMVar7;
    *ppMVar7 = (Message *)0x0;
  }
  return (Message *)this_local;
}

Assistant:

Message* Reflection::UnsafeArenaReleaseMessage(Message* message,
                                               const FieldDescriptor* field,
                                               MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || schema_.InRealOneof(field))) {
      ClearHasBit(message, field);
    }
    if (schema_.InRealOneof(field)) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return nullptr;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = nullptr;
    return ret;
  }
}